

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O1

long coda_ascii_parse_uint64
               (char *buffer,long buffer_length,uint64_t *dst,int ignore_trailing_bytes)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  uint64_t uVar7;
  
  lVar5 = buffer_length;
  if (0 < buffer_length) {
    pcVar6 = buffer + buffer_length;
    do {
      if ((*buffer != ' ') && (*buffer != '\t')) goto LAB_0014fbf2;
      buffer = buffer + 1;
      bVar1 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar1);
    lVar5 = 0;
    buffer = pcVar6;
  }
LAB_0014fbf2:
  pcVar6 = buffer + (*buffer == '+');
  lVar5 = lVar5 - (ulong)(*buffer == '+');
  iVar4 = 0;
  uVar7 = 0;
  do {
    if (lVar5 < 1) goto LAB_0014fc74;
    iVar2 = 5;
    if (0xf5 < (byte)(*pcVar6 - 0x3aU)) {
      uVar3 = (ulong)(byte)(*pcVar6 - 0x30);
      if (~uVar3 / 10 < uVar7) {
        coda_set_error(-0x67,"value too large for ascii integer");
        iVar2 = 1;
      }
      else {
        uVar7 = uVar3 + uVar7 * 10;
        iVar4 = iVar4 + 1;
        pcVar6 = pcVar6 + 1;
        lVar5 = lVar5 + -1;
        iVar2 = 0;
      }
    }
  } while (iVar2 == 0);
  if (iVar2 == 5) {
LAB_0014fc74:
    if (iVar4 == 0) {
      pcVar6 = "invalid format for ascii integer (no digits)";
    }
    else {
      if ((ignore_trailing_bytes != 0) || (lVar5 == 0)) {
LAB_0014fcd6:
        *dst = uVar7;
        return buffer_length - lVar5;
      }
      if (0 < lVar5) {
        do {
          if ((*pcVar6 != ' ') && (*pcVar6 != '\t')) goto LAB_0014fca9;
          pcVar6 = pcVar6 + 1;
          bVar1 = 1 < lVar5;
          lVar5 = lVar5 + -1;
        } while (bVar1);
        lVar5 = 0;
LAB_0014fca9:
        if (lVar5 == 0) {
          lVar5 = 0;
          goto LAB_0014fcd6;
        }
      }
      pcVar6 = "invalid format for ascii integer";
    }
    coda_set_error(-0x67,pcVar6);
  }
  return -1;
}

Assistant:

long coda_ascii_parse_uint64(const char *buffer, long buffer_length, uint64_t *dst, int ignore_trailing_bytes)
{
    long length;
    int integer_length;
    uint64_t value;

    length = buffer_length;

    while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
    {
        buffer++;
        length--;
    }

    if (*buffer == '+')
    {
        buffer++;
        length--;
    }

    value = 0;
    integer_length = 0;
    while (length > 0)
    {
        int64_t digit;

        if (*buffer < '0' || *buffer > '9')
        {
            break;
        }
        digit = *buffer - '0';
        if (value > (MAXUINT64 - digit) / 10)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "value too large for ascii integer");
            return -1;
        }
        value = 10 * value + digit;
        integer_length++;
        buffer++;
        length--;
    }
    if (integer_length == 0)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer (no digits)");
        return -1;
    }
    if (!ignore_trailing_bytes && length != 0)
    {
        while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
        {
            buffer++;
            length--;
        }
        if (length != 0)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer");
            return -1;
        }
    }

    *dst = value;

    return buffer_length - length;
}